

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::msgpack::basic_msgpack_cursor<jsoncons::bytes_source,_std::allocator<char>_>::reset
          (basic_msgpack_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this)

{
  int iVar1;
  
  basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_>::reset(&this->parser_);
  basic_staj_visitor<char>::reset(&this->cursor_visitor_);
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::reset
            (&this->cursor_handler_adaptor_);
  this->eof_ = false;
  iVar1 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(this);
  if ((char)iVar1 != '\0') {
    return;
  }
  (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(this);
  return;
}

Assistant:

void reset()
    {
        parser_.reset();
        cursor_visitor_.reset();
        cursor_handler_adaptor_.reset();
        eof_ = false;
        if (!done())
        {
            next();
        }
    }